

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

bool __thiscall ON_BinaryArchive::WriteInt16(ON_BinaryArchive *this,size_t count,ON__INT16 *p)

{
  size_t sVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  if (this->m_endian == big_endian) {
    if (count == 0) {
      bVar4 = true;
    }
    else {
      lVar2 = count - 1;
      do {
        sVar1 = Write(this,1,(void *)((long)p + 1));
        bVar4 = sVar1 == 1;
        if (bVar4) {
          sVar1 = Write(this,1,p);
          bVar4 = sVar1 == 1;
        }
        bVar3 = lVar2 != 0;
        lVar2 = lVar2 + -1;
      } while ((bVar4 != false) && (p = p + 1, bVar3));
    }
  }
  else {
    sVar1 = Write(this,count * 2,p);
    bVar4 = sVar1 == count * 2;
  }
  return bVar4;
}

Assistant:

bool
ON_BinaryArchive::WriteInt16(   // Write an array of 16 bit shorts
		size_t count,               // number of shorts to write
		const ON__INT16* p
		)
{
  bool rc = true;
  if (m_endian == ON::endian::big_endian)
  {
    if ( count > 0 ) 
    {
      const char* b = (const char*)p;
      while ( rc && count-- ) 
      {
        rc = WriteByte( 1, b+1 );
        if (rc)
          rc = WriteByte( 1, b );
        b++;
        b++;
      }
    }
  }
  else 
  {
    rc = WriteByte( count<<1, p );
  }
  return rc;
}